

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_table_clear(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  long in_RSI;
  jit_State *in_RDI;
  TRef tr;
  
  uVar1 = *in_RDI->base;
  if ((uVar1 & 0x1f000000) == 0xb000000) {
    *(undefined8 *)(in_RSI + 8) = 0;
    lj_ir_call(in_RDI,IRCALL_lj_tab_clear,(ulong)uVar1);
    in_RDI->needsnap = '\x01';
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_table_clear(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  if (tref_istab(tr)) {
    rd->nres = 0;
    lj_ir_call(J, IRCALL_lj_tab_clear, tr);
    J->needsnap = 1;
  }  /* else: Interpreter will throw. */
}